

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

void sad128x1(uint16_t *src_ptr,uint16_t *ref_ptr,uint16_t *sec_ptr,__m256i *sad_acc)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  int i;
  __m256i r [4];
  __m256i s [4];
  int local_2c4;
  undefined1 auVar2 [24];
  undefined1 (*local_1b8) [32];
  undefined1 (*local_1b0) [32];
  
  local_1b8 = in_RDX;
  local_1b0 = in_RSI;
  for (local_2c4 = 0; local_2c4 < 2; local_2c4 = local_2c4 + 1) {
    auVar2 = SUB3224(local_1b0[1],0);
    if (local_1b8 != (undefined1 (*) [32])0x0) {
      vpavgw_avx2(*local_1b0,*local_1b8);
      auVar1 = vpavgw_avx2(local_1b0[1],local_1b8[1]);
      auVar2 = auVar1._0_24_;
      vpavgw_avx2(local_1b0[2],local_1b8[2]);
      vpavgw_avx2(local_1b0[3],local_1b8[3]);
      local_1b8 = local_1b8 + 4;
    }
    highbd_sad16x4_core_avx2(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
    local_1b0 = local_1b0 + 4;
  }
  return;
}

Assistant:

static void sad128x1(const uint16_t *src_ptr, const uint16_t *ref_ptr,
                     const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int i;
  for (i = 0; i < 2; i++) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + 32));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + 48));
    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 32));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 48));
    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 64;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);
    src_ptr += 64;
    ref_ptr += 64;
  }
}